

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StorageReader.cpp
# Opt level: O0

blob_metadata * __thiscall
MILBlob::Blob::StorageReader::Impl::GetMetadata
          (blob_metadata *__return_storage_ptr__,Impl *this,uint64_t offset)

{
  pointer this_00;
  blob_metadata *__src;
  runtime_error *this_01;
  uint64_t offset_local;
  Impl *this_local;
  
  EnsureLoaded(this);
  this_00 = std::
            unique_ptr<const_MILBlob::Blob::MMapFileReader,_std::default_delete<const_MILBlob::Blob::MMapFileReader>_>
            ::operator->(&this->m_reader);
  __src = MMapFileReader::ReadStruct<MILBlob::Blob::blob_metadata>(this_00,offset);
  memcpy(__return_storage_ptr__,__src,0x40);
  if (__return_storage_ptr__->sentinel != 0xdeadbeef) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"Invalid sentinel in blob_metadata.");
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return __return_storage_ptr__;
}

Assistant:

blob_metadata GetMetadata(uint64_t offset) const
    {
        EnsureLoaded();

        blob_metadata metadata = m_reader->ReadStruct<blob_metadata>(offset);

        // validate sentinel
        MILVerifyIsTrue(metadata.sentinel == BlobMetadataSentinel,
                        std::runtime_error,
                        "Invalid sentinel in blob_metadata.");
        return metadata;
    }